

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keccak_test.cc
# Opt level: O3

void KeccakFileTest(FileTest *t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *__ptr_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  char *pcVar2;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  size_t i;
  ulong uVar3;
  long lVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> shake256_expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> shake128_expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sha3_512_expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sha3_256_expected;
  uint8_t sha3_512_digest [64];
  BORINGSSL_keccak_st ctx;
  uint8_t shake128_output [512];
  uint8_t shake256_output [512];
  uint8_t sha3_256_digest [32];
  undefined1 local_648 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_640;
  Bytes local_638;
  Bytes local_628;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_618;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_5f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_5d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_5b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_598;
  AssertHelperData local_578;
  undefined1 local_530 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_528;
  string local_448 [16];
  internal local_248 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240 [63];
  uint8_t local_48 [40];
  
  local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint8_t *)0x0;
  local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_598.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_598.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_598.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar1 = &local_448[0].field_2;
  local_448[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"Input","");
  local_248[0] = (internal)FileTest::GetBytes(t,&local_618,local_448);
  local_240[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448[0]._M_dataplus._M_p == paVar1) {
    if ((bool)local_248[0]) goto LAB_002f90f2;
LAB_002f9451:
    testing::Message::Message((Message *)local_530);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_448,local_248,(AssertionResult *)"t->GetBytes(&input, \"Input\")","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
               ,0x1f,local_448[0]._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,(Message *)local_530);
LAB_002f96bc:
    this = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_240;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_448[0]._M_dataplus._M_p,local_448[0].field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_530._1_7_,local_530[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_530._1_7_,local_530[0]) + 8))();
    }
    __ptr_00 = local_240[0];
    if (local_240[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_002f970e;
  }
  else {
    operator_delete(local_448[0]._M_dataplus._M_p,local_448[0].field_2._M_allocated_capacity + 1);
    if (((byte)local_248[0] & 1) == 0) goto LAB_002f9451;
LAB_002f90f2:
    if (local_240[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_240,local_240[0]);
    }
    local_448[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"SHA3-256","");
    local_248[0] = (internal)FileTest::GetBytes(t,&local_598,local_448);
    local_240[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_448[0]._M_dataplus._M_p,local_448[0].field_2._M_allocated_capacity + 1);
      if (((byte)local_248[0] & 1) != 0) goto LAB_002f917f;
LAB_002f94d0:
      testing::Message::Message((Message *)local_530);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (local_448,local_248,
                 (AssertionResult *)"t->GetBytes(&sha3_256_expected, \"SHA3-256\")","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_578,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                 ,0x20,local_448[0]._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,(Message *)local_530);
      goto LAB_002f96bc;
    }
    if (!(bool)local_248[0]) goto LAB_002f94d0;
LAB_002f917f:
    if (local_240[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_240,local_240[0]);
    }
    local_448[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"SHA3-512","");
    local_248[0] = (internal)FileTest::GetBytes(t,&local_5b8,local_448);
    local_240[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448[0]._M_dataplus._M_p == paVar1) {
      if (!(bool)local_248[0]) goto LAB_002f954f;
    }
    else {
      operator_delete(local_448[0]._M_dataplus._M_p,local_448[0].field_2._M_allocated_capacity + 1);
      if (((byte)local_248[0] & 1) == 0) {
LAB_002f954f:
        testing::Message::Message((Message *)local_530);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (local_448,local_248,
                   (AssertionResult *)"t->GetBytes(&sha3_512_expected, \"SHA3-512\")","false","true"
                   ,in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_578,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                   ,0x21,local_448[0]._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,(Message *)local_530);
        goto LAB_002f96bc;
      }
    }
    if (local_240[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_240,local_240[0]);
    }
    local_448[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"SHAKE-128","");
    local_248[0] = (internal)FileTest::GetBytes(t,&local_5d8,local_448);
    local_240[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448[0]._M_dataplus._M_p == paVar1) {
      if (!(bool)local_248[0]) goto LAB_002f95ce;
    }
    else {
      operator_delete(local_448[0]._M_dataplus._M_p,local_448[0].field_2._M_allocated_capacity + 1);
      if (((byte)local_248[0] & 1) == 0) {
LAB_002f95ce:
        testing::Message::Message((Message *)local_530);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (local_448,local_248,
                   (AssertionResult *)"t->GetBytes(&shake128_expected, \"SHAKE-128\")","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_578,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                   ,0x22,local_448[0]._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,(Message *)local_530);
        goto LAB_002f96bc;
      }
    }
    if (local_240[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_240,local_240[0]);
    }
    local_448[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"SHAKE-256","");
    local_248[0] = (internal)FileTest::GetBytes(t,&local_5f8,local_448);
    local_240[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448[0]._M_dataplus._M_p == paVar1) {
      if (!(bool)local_248[0]) goto LAB_002f964a;
    }
    else {
      operator_delete(local_448[0]._M_dataplus._M_p,local_448[0].field_2._M_allocated_capacity + 1);
      if (((byte)local_248[0] & 1) == 0) {
LAB_002f964a:
        testing::Message::Message((Message *)local_530);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (local_448,local_248,
                   (AssertionResult *)"t->GetBytes(&shake256_expected, \"SHAKE-256\")","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_578,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                   ,0x23,local_448[0]._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,(Message *)local_530);
        goto LAB_002f96bc;
      }
    }
    if (local_240[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_240,local_240[0]);
    }
    BORINGSSL_keccak(local_48,0x20,
                     local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)local_618.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_618.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,boringssl_sha3_256);
    BORINGSSL_keccak((uint8_t *)&local_578,0x40,
                     local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)local_618.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_618.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,boringssl_sha3_512);
    BORINGSSL_keccak((uint8_t *)local_448,0x200,
                     local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)local_618.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_618.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,boringssl_shake128);
    BORINGSSL_keccak((uint8_t *)local_248,0x200,
                     local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)local_618.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_618.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,boringssl_shake256);
    local_640 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)local_598.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)local_598.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    local_648 = (undefined1  [8])
                local_598.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_638.span_.size_ = 0x20;
    local_638.span_.data_ = local_48;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_530,"Bytes(sha3_256_expected)","Bytes(sha3_256_digest)",
               (Bytes *)local_648,&local_638);
    if (local_530[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_648);
      if (local_528 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_528->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_638,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                 ,0x32,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_638,(Message *)local_648);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_638);
      if (local_648 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_648 + 8))();
      }
    }
    if (local_528 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_528,local_528);
    }
    local_640 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    local_648 = (undefined1  [8])
                local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_638.span_.size_ = 0x40;
    local_638.span_.data_ = (uchar *)&local_578;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_530,"Bytes(sha3_512_expected)","Bytes(sha3_512_digest)",
               (Bytes *)local_648,&local_638);
    if (local_530[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_648);
      if (local_528 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_528->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_638,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                 ,0x33,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_638,(Message *)local_648);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_638);
      if (local_648 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_648 + 8))();
      }
    }
    if (local_528 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_528,local_528);
    }
    local_640 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)local_5d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)local_5d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    local_648 = (undefined1  [8])
                local_5d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_638.span_.size_ = 0x200;
    local_638.span_.data_ = (uchar *)local_448;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_530,"Bytes(shake128_expected)","Bytes(shake128_output)",
               (Bytes *)local_648,&local_638);
    if (local_530[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_648);
      if (local_528 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_528->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_638,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                 ,0x34,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_638,(Message *)local_648);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_638);
      if (local_648 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_648 + 8))();
      }
    }
    if (local_528 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_528,local_528);
    }
    local_640 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish +
                -(long)local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    local_648 = (undefined1  [8])
                local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_638.span_.size_ = 0x200;
    local_638.span_.data_ = (uchar *)local_248;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_530,"Bytes(shake256_expected)","Bytes(shake256_output)",
               (Bytes *)local_648,&local_638);
    if (local_530[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_648);
      if (local_528 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_528->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_638,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                 ,0x35,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_638,(Message *)local_648);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_638);
      if (local_648 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_648 + 8))();
      }
    }
    if (local_528 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_528,local_528);
    }
    memset(local_448,0,0x200);
    BORINGSSL_keccak_init((BORINGSSL_keccak_st *)local_530,boringssl_shake128);
    BORINGSSL_keccak_absorb
              ((BORINGSSL_keccak_st *)local_530,
               local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
    BORINGSSL_keccak_squeeze((BORINGSSL_keccak_st *)local_530,(uint8_t *)local_448,0x200);
    local_638.span_.size_ =
         (long)local_5d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_5d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_638.span_.data_ =
         local_5d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_628.span_.size_ = 0x200;
    local_628.span_.data_ = (uchar *)local_448;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_648,"Bytes(shake128_expected)","Bytes(shake128_output)",&local_638,
               &local_628);
    if (local_648[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_638);
      if (local_640 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_640->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_628,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                 ,0x3e,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_628,(Message *)&local_638);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_628);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_638.span_.data_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_638.span_.data_ + 8))();
      }
    }
    if (local_640 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_640,local_640);
    }
    memset(local_248,0,0x200);
    BORINGSSL_keccak_init((BORINGSSL_keccak_st *)local_530,boringssl_shake256);
    BORINGSSL_keccak_absorb
              ((BORINGSSL_keccak_st *)local_530,
               local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
    BORINGSSL_keccak_squeeze((BORINGSSL_keccak_st *)local_530,(uint8_t *)local_248,0x200);
    local_638.span_.size_ =
         (long)local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_638.span_.data_ =
         local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_628.span_.size_ = 0x200;
    local_628.span_.data_ = (uchar *)local_248;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_648,"Bytes(shake256_expected)","Bytes(shake256_output)",&local_638,
               &local_628);
    if (local_648[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_638);
      if (local_640 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_640->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_628,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                 ,0x44,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_628,(Message *)&local_638);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_628);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_638.span_.data_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_638.span_.data_ + 8))();
      }
    }
    if (local_640 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_640,local_640);
    }
    memset(local_448,0,0x200);
    BORINGSSL_keccak_init((BORINGSSL_keccak_st *)local_530,boringssl_shake128);
    if (local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar3 = 0;
      do {
        BORINGSSL_keccak_absorb
                  ((BORINGSSL_keccak_st *)local_530,
                   local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar3,1);
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)((long)local_618.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_618.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start));
    }
    lVar4 = 0;
    do {
      BORINGSSL_keccak_squeeze
                ((BORINGSSL_keccak_st *)local_530,
                 (uint8_t *)((long)&local_448[0]._M_dataplus._M_p + lVar4),1);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x200);
    local_638.span_.size_ =
         (long)local_5d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_5d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_638.span_.data_ =
         local_5d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_628.span_.size_ = 0x200;
    local_628.span_.data_ = (uchar *)local_448;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_648,"Bytes(shake128_expected)","Bytes(shake128_output)",&local_638,
               &local_628);
    if (local_648[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_638);
      if (local_640 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_640->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_628,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                 ,0x4f,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_628,(Message *)&local_638);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_628);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_638.span_.data_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_638.span_.data_ + 8))();
      }
    }
    if (local_640 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_640,local_640);
    }
    memset(local_248,0,0x200);
    BORINGSSL_keccak_init((BORINGSSL_keccak_st *)local_530,boringssl_shake256);
    if (local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar3 = 0;
      do {
        BORINGSSL_keccak_absorb
                  ((BORINGSSL_keccak_st *)local_530,
                   local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar3,1);
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)((long)local_618.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_618.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start));
    }
    lVar4 = 0;
    do {
      BORINGSSL_keccak_squeeze((BORINGSSL_keccak_st *)local_530,(uint8_t *)(local_248 + lVar4),1);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x200);
    local_638.span_.size_ =
         (long)local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_638.span_.data_ =
         local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_628.span_.size_ = 0x200;
    local_628.span_.data_ = (uchar *)local_248;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_648,"Bytes(shake256_expected)","Bytes(shake256_output)",&local_638,
               &local_628);
    if (local_648[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_638);
      if (local_640 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_640->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_628,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/keccak/keccak_test.cc"
                 ,0x59,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_628,(Message *)&local_638);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_628);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_638.span_.data_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_638.span_.data_ + 8))();
      }
    }
    if (local_640 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_002f970e;
    this = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&local_640;
    __ptr_00 = local_640;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this,__ptr_00);
LAB_002f970e:
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_5f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_5f8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_5f8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_5d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_5d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_5d8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_5d8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_5b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_5b8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_5b8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_598.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_598.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_598.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_598.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_618.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_618.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_618.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void KeccakFileTest(FileTest *t) {
  std::vector<uint8_t> input, sha3_256_expected, sha3_512_expected,
      shake128_expected, shake256_expected;
  ASSERT_TRUE(t->GetBytes(&input, "Input"));
  ASSERT_TRUE(t->GetBytes(&sha3_256_expected, "SHA3-256"));
  ASSERT_TRUE(t->GetBytes(&sha3_512_expected, "SHA3-512"));
  ASSERT_TRUE(t->GetBytes(&shake128_expected, "SHAKE-128"));
  ASSERT_TRUE(t->GetBytes(&shake256_expected, "SHAKE-256"));

  uint8_t sha3_256_digest[32];
  BORINGSSL_keccak(sha3_256_digest, sizeof(sha3_256_digest), input.data(),
                   input.size(), boringssl_sha3_256);
  uint8_t sha3_512_digest[64];
  BORINGSSL_keccak(sha3_512_digest, sizeof(sha3_512_digest), input.data(),
                   input.size(), boringssl_sha3_512);
  uint8_t shake128_output[512];
  BORINGSSL_keccak(shake128_output, sizeof(shake128_output), input.data(),
                   input.size(), boringssl_shake128);
  uint8_t shake256_output[512];
  BORINGSSL_keccak(shake256_output, sizeof(shake256_output), input.data(),
                   input.size(), boringssl_shake256);

  EXPECT_EQ(Bytes(sha3_256_expected), Bytes(sha3_256_digest));
  EXPECT_EQ(Bytes(sha3_512_expected), Bytes(sha3_512_digest));
  EXPECT_EQ(Bytes(shake128_expected), Bytes(shake128_output));
  EXPECT_EQ(Bytes(shake256_expected), Bytes(shake256_output));

  struct BORINGSSL_keccak_st ctx;

  // Single-pass absorb/squeeze.
  OPENSSL_memset(shake128_output, 0, sizeof(shake128_output));
  BORINGSSL_keccak_init(&ctx, boringssl_shake128);
  BORINGSSL_keccak_absorb(&ctx, input.data(), input.size());
  BORINGSSL_keccak_squeeze(&ctx, shake128_output, sizeof(shake128_output));
  EXPECT_EQ(Bytes(shake128_expected), Bytes(shake128_output));

  OPENSSL_memset(shake256_output, 0, sizeof(shake256_output));
  BORINGSSL_keccak_init(&ctx, boringssl_shake256);
  BORINGSSL_keccak_absorb(&ctx, input.data(), input.size());
  BORINGSSL_keccak_squeeze(&ctx, shake256_output, sizeof(shake256_output));
  EXPECT_EQ(Bytes(shake256_expected), Bytes(shake256_output));

  // Byte-by-byte absorb/squeeze.
  OPENSSL_memset(shake128_output, 0, sizeof(shake128_output));
  BORINGSSL_keccak_init(&ctx, boringssl_shake128);
  for (size_t i = 0; i < input.size(); i++) {
    BORINGSSL_keccak_absorb(&ctx, &input[i], 1);
  }
  for (size_t i = 0; i < sizeof(shake128_output); i++) {
    BORINGSSL_keccak_squeeze(&ctx, &shake128_output[i], 1);
  }
  EXPECT_EQ(Bytes(shake128_expected), Bytes(shake128_output));

  OPENSSL_memset(shake256_output, 0, sizeof(shake256_output));
  BORINGSSL_keccak_init(&ctx, boringssl_shake256);
  for (size_t i = 0; i < input.size(); i++) {
    BORINGSSL_keccak_absorb(&ctx, &input[i], 1);
  }
  for (size_t i = 0; i < sizeof(shake256_output); i++) {
    BORINGSSL_keccak_squeeze(&ctx, &shake256_output[i], 1);
  }
  EXPECT_EQ(Bytes(shake256_expected), Bytes(shake256_output));
}